

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallHeapBlockAllocator.cpp
# Opt level: O0

void __thiscall
Memory::SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>::
TrackNativeAllocatedObjects
          (SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
           *this)

{
  FreeObject *pFVar1;
  Recycler *this_00;
  code *pcVar2;
  bool bVar3;
  FreeObject *pFVar4;
  ConfigFlagsTable *pCVar5;
  ulong uVar6;
  undefined8 *in_FS_OFFSET;
  FreeObject *local_28;
  char *curr;
  size_t sizeCat;
  Recycler *recycler;
  SmallHeapBlockAllocator<Memory::SmallNormalHeapBlockT<MediumAllocationBlockAttributes>_>
  *this_local;
  
  if ((this->freeObjectList == (FreeObject *)0x0) || (this->endAddress == (char *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xd3,"(this->freeObjectList != nullptr && endAddress != nullptr)",
                       "this->freeObjectList != nullptr && endAddress != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (this->heapBlock == (SmallNormalHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                       ,0xd4,"(this->heapBlock != nullptr)","this->heapBlock != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (this->pfnTrackNativeAllocatedObjectCallBack != (_func_void_Recycler_ptr_void_ptr_size_t *)0x0)
  {
    if (this->lastNonNativeBumpAllocatedBlock == (char *)0x0) {
      pFVar1 = this->freeObjectList;
      pFVar4 = (FreeObject *)
               SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAddress
                         (&this->heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>);
      if (pFVar1 != pFVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                           ,0xde,"((char *)this->freeObjectList == this->heapBlock->GetAddress())",
                           "(char *)this->freeObjectList == this->heapBlock->GetAddress()");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
    }
    else {
      this_00 = ((this->heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).
                heapBucket)->heapInfo->recycler;
      uVar6 = (ulong)((this->heapBlock->super_SmallHeapBlockT<MediumAllocationBlockAttributes>).
                     heapBucket)->sizeCat;
      local_28 = (FreeObject *)(this->lastNonNativeBumpAllocatedBlock + uVar6);
      if (this->freeObjectList < local_28) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *(undefined4 *)*in_FS_OFFSET = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.cpp"
                           ,0xe5,"(curr <= (char *)this->freeObjectList)",
                           "curr <= (char *)this->freeObjectList");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *(undefined4 *)*in_FS_OFFSET = 0;
      }
      pCVar5 = Recycler::GetRecyclerFlagsTable(this_00);
      if ((pCVar5->Verbose & 1U) != 0) {
        pCVar5 = Recycler::GetRecyclerFlagsTable(this_00);
        bVar3 = Js::Phases::IsEnabled(&pCVar5->Trace,MemoryAllocationPhase);
        if (bVar3) {
          Output::Print(L"TrackNativeAllocatedObjects: recycler = 0x%p, sizeCat = %u, lastRuntimeAllocatedBlock = 0x%p, freeObjectList = 0x%p, nativeAllocatedObjectCount = %u\n"
                        ,this_00,uVar6,this->lastNonNativeBumpAllocatedBlock,this->freeObjectList,
                        (ulong)((long)this->freeObjectList - (long)local_28) / uVar6);
        }
      }
      for (; local_28 < this->freeObjectList;
          local_28 = (FreeObject *)((long)&local_28->taggedNext + uVar6)) {
        (*this->pfnTrackNativeAllocatedObjectCallBack)(this_00,local_28,uVar6);
      }
    }
  }
  return;
}

Assistant:

void
SmallHeapBlockAllocator<TBlockType>::TrackNativeAllocatedObjects()
{
    Assert(this->freeObjectList != nullptr && endAddress != nullptr);
    Assert(this->heapBlock != nullptr);

#if defined(PROFILE_RECYCLER_ALLOC) || defined(RECYCLER_MEMORY_VERIFY) || defined(MEMSPECT_TRACKING) || defined(ETW_MEMORY_TRACKING)
    if (pfnTrackNativeAllocatedObjectCallBack == nullptr)
    {
        return;
    }

    if (lastNonNativeBumpAllocatedBlock == nullptr)
    {
        Assert((char *)this->freeObjectList == this->heapBlock->GetAddress());
        return;
    }

    Recycler * recycler = this->heapBlock->heapBucket->heapInfo->recycler;
    size_t sizeCat = this->heapBlock->heapBucket->sizeCat;
    char * curr = lastNonNativeBumpAllocatedBlock + sizeCat;
    Assert(curr <= (char *)this->freeObjectList);

#if DBG_DUMP
    AllocationVerboseTrace(recycler->GetRecyclerFlagsTable(), _u("TrackNativeAllocatedObjects: recycler = 0x%p, sizeCat = %u, lastRuntimeAllocatedBlock = 0x%p, freeObjectList = 0x%p, nativeAllocatedObjectCount = %u\n"),
        recycler, sizeCat, this->lastNonNativeBumpAllocatedBlock, this->freeObjectList, ((char *)this->freeObjectList - curr) / sizeCat);
#endif

    while (curr < (char *)this->freeObjectList)
    {
        pfnTrackNativeAllocatedObjectCallBack(recycler, curr, sizeCat);
        curr += sizeCat;
    }
#elif defined(RECYCLER_PERF_COUNTERS)
    if (lastNonNativeBumpAllocatedBlock == nullptr)
    {
        return;
    }

    size_t sizeCat = this->heapBlock->heapBucket->sizeCat;
    char * curr = lastNonNativeBumpAllocatedBlock + sizeCat;
    Assert(curr <= (char *)this->freeObjectList);
    size_t byteCount = ((char *)this->freeObjectList - curr);

#if DBG_DUMP
    AllocationVerboseTrace(_u("TrackNativeAllocatedObjects: recycler = 0x%p, sizeCat = %u, lastRuntimeAllocatedBlock = 0x%p, freeObjectList = 0x%p, nativeAllocatedObjectCount = %u\n"),
        recycler, sizeCat, this->lastNonNativeBumpAllocatedBlock, this->freeObjectList, ((char *)this->freeObjectList - curr) / sizeCat);
#endif

    RECYCLER_PERF_COUNTER_ADD(LiveObject, byteCount / sizeCat);
    RECYCLER_PERF_COUNTER_ADD(LiveObjectSize, byteCount);
    RECYCLER_PERF_COUNTER_SUB(FreeObjectSize, byteCount);
    RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObject, byteCount / sizeCat);
    RECYCLER_PERF_COUNTER_ADD(SmallHeapBlockLiveObjectSize, byteCount);
    RECYCLER_PERF_COUNTER_SUB(SmallHeapBlockFreeObjectSize, byteCount);
#else
#error Not implemented
#endif
}